

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O2

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::rescale
          (ExponentiallyDecayingReservoir *this,time_t now,time_t next)

{
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  *this_00;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  _Base_ptr p_Var3;
  iterator __position;
  mapped_type *this_01;
  _Rb_tree_header *p_Var4;
  __node_base *p_Var5;
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  *__range2;
  double dVar6;
  double weight;
  unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_> keys;
  double local_80;
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_78;
  WeightedSample local_40;
  
  std::mutex::lock(&this->m_mutex);
  this->m_next_rescale_time = now + 0x3c;
  lVar1 = this->m_start;
  iVar2 = (*this->m_clock->_vptr_Clock[1])();
  this->m_start = CONCAT44(extraout_var,iVar2);
  dVar6 = exp((double)(CONCAT44(extraout_var,iVar2) - lVar1) * -this->m_alpha);
  if (dVar6 == 0.0) {
    std::
    _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
    ::clear(&(this->m_samples)._M_t);
  }
  else {
    local_78._M_buckets = &local_78._M_single_bucket;
    local_78._M_bucket_count = 1;
    local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_78._M_element_count = 0;
    local_78._M_rehash_policy._M_max_load_factor = 1.0;
    local_78._M_rehash_policy._M_next_resize = 0;
    local_78._M_single_bucket = (__node_base_ptr)0x0;
    std::__detail::
    _Rehash_base<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
    ::reserve((_Rehash_base<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
               *)&local_78,(this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var5 = &local_78._M_before_begin;
    this_00 = &this->m_samples;
    p_Var4 = &(this->m_samples)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var3 = (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__detail::
      _Insert_base<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_78,(value_type *)(p_Var3 + 1));
    }
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      __position = std::
                   _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                   ::find(&this_00->_M_t,(key_type *)(p_Var5 + 1));
      if ((_Rb_tree_header *)__position._M_node == p_Var4) {
        __assert_fail("it != m_samples.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/benjamin-bader[P]cppmetrics/metrics/src/ExponentiallyDecayingReservoir.cc"
                      ,0xc0,
                      "void cppmetrics::ExponentiallyDecayingReservoir::rescale(std::time_t, std::time_t)"
                     );
      }
      p_Var3 = __position._M_node[1]._M_parent;
      weight = (double)__position._M_node[1]._M_left * dVar6;
      std::
      _Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                          *)this_00,__position);
      if (weight != 0.0) {
        WeightedSample::WeightedSample(&local_40,(long)p_Var3,weight);
        local_80 = (double)p_Var5[1]._M_nxt * dVar6;
        this_01 = std::
                  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                  ::operator[](this_00,&local_80);
        WeightedSample::operator=(this_01,&local_40);
      }
    }
    std::
    _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_78);
  }
  LOCK();
  (this->m_count).super___atomic_base<long>._M_i =
       (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ExponentiallyDecayingReservoir::rescale(std::time_t now, std::time_t next)
{
  std::lock_guard<std::mutex> lock(m_mutex);

  m_next_rescale_time = now + kRescalePeriod;
  const auto old_start_time = m_start;
  m_start = m_clock->now_as_time_t();

  const double scaling_factor = exp(-m_alpha * (m_start - old_start_time));
  if (HasEquivalentOrder(scaling_factor, 0.0))
  {
    m_samples.clear();
  }
  else
  {
    std::unordered_set<double> keys;
    keys.reserve(m_samples.size());
    for (auto&& pair : m_samples)
    {
      keys.insert(pair.first);
    }

    for (auto&& key : keys)
    {
      auto it = m_samples.find(key);
      assert(it != m_samples.end());
      auto value = it->second.get_value();
      auto new_weight = it->second.get_weight() * scaling_factor;
      m_samples.erase(it);

      if (!HasEquivalentOrder(new_weight, 0))
      {
        m_samples[key * scaling_factor] = {value, new_weight};
      }
    }
  }

  m_count.store(m_samples.size());
}